

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolver_sync.c
# Opt level: O2

_Bool dns_resolver_is_lookup_complete(DNSRESOLVER_HANDLE dns_in)

{
  int iVar1;
  uint uVar2;
  LOGGER_LOG p_Var3;
  addrinfo *addrInfo;
  char portString [16];
  addrinfo local_48;
  
  if (dns_in == (DNSRESOLVER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/dns_resolver_sync.c"
                ,"dns_resolver_is_lookup_complete",0x5a,1,"NULL dns");
    }
  }
  else if (*(char *)((long)dns_in + 0x10) == '\0') {
    addrInfo = (addrinfo *)0x0;
    local_48.ai_flags = 0;
    local_48.ai_protocol = 0;
    local_48.ai_canonname = (char *)0x0;
    local_48.ai_next = (addrinfo *)0x0;
    local_48.ai_addrlen = 0;
    local_48._20_4_ = 0;
    local_48.ai_addr = (sockaddr *)0x0;
    local_48.ai_family = 2;
    local_48.ai_socktype = 1;
    iVar1 = sprintf(portString,"%u",(ulong)*(uint *)((long)dns_in + 8));
    if (iVar1 < 0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/dns_resolver_sync.c"
                  ,"dns_resolver_is_lookup_complete",0x7f,1,
                  "Failure: sprintf failed to encode the port.");
      }
    }
    uVar2 = getaddrinfo(*dns_in,portString,&local_48,(addrinfo **)&addrInfo);
    if (uVar2 == 0) {
      *(addrinfo **)((long)dns_in + 0x18) = addrInfo;
      for (; addrInfo != (addrinfo *)0x0; addrInfo = addrInfo->ai_next) {
        if (addrInfo->ai_family == 2) {
          *(undefined4 *)((long)dns_in + 0xc) = *(undefined4 *)(addrInfo->ai_addr->sa_data + 2);
          *(undefined1 *)((long)dns_in + 0x11) = 0;
        }
      }
      *(bool *)((long)dns_in + 0x11) = *(int *)((long)dns_in + 0xc) == 0;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/dns_resolver_sync.c"
                  ,"dns_resolver_is_lookup_complete",0xa5,1,"Failed DNS lookup for %s: %d",*dns_in,
                  (ulong)uVar2);
      }
      *(undefined1 *)((long)dns_in + 0x11) = 1;
    }
    *(undefined1 *)((long)dns_in + 0x10) = 1;
  }
  return dns_in != (DNSRESOLVER_HANDLE)0x0;
}

Assistant:

bool dns_resolver_is_lookup_complete(DNSRESOLVER_HANDLE dns_in)
{
    DNSRESOLVER_INSTANCE* dns = (DNSRESOLVER_INSTANCE*)dns_in;

    bool result;
    if (dns == NULL)
    {
        /* Codes_SRS_dns_resolver_30_020: [ If the dns parameter is NULL, dns_resolver_is_create_complete shall log an error and return false. ]*/
        LogError("NULL dns");
        result = false;
    }
    else
    {
        if (dns->is_complete)
        {
            /* Codes_SRS_dns_resolver_30_024: [ If dns_resolver_is_create_complete has previously returned true, dns_resolver_is_create_complete shall do nothing and return true. ]*/
            result = true;
        }
        else
        {
            char portString[16];
            struct addrinfo *addrInfo = NULL;
            struct addrinfo *ptr = NULL;
            struct addrinfo hints;
            int getAddrResult;

            //--------------------------------
            // Setup the hints address info structure
            // which is passed to the getaddrinfo() function
            memset(&hints, 0, sizeof(hints));
#ifdef IPV6_ENABLED
            hints.ai_family = AF_UNSPEC;
#else
            hints.ai_family = AF_INET;
#endif // IPV6_ENABLED
            hints.ai_socktype = SOCK_STREAM;
            hints.ai_protocol = 0;

            //--------------------------------
            // Call getaddrinfo(). If the call succeeds,
            // the result variable will hold a linked list
            // of addrinfo structures containing response
            // information
            if (sprintf(portString, "%u", dns->port) < 0)
            {
                LogError("Failure: sprintf failed to encode the port.");
                result = MU_FAILURE;
            }

            getAddrResult = getaddrinfo(dns->hostname, portString, &hints, &addrInfo);
            if (getAddrResult == 0)
            {
                dns->addrInfo = addrInfo;
                
                // If we find the AF_INET address, use it as the return value
                for (ptr = addrInfo; ptr != NULL; ptr = ptr->ai_next)
                {
                    switch (ptr->ai_family)
                    {
                    case AF_INET:
                        /* Codes_SRS_dns_resolver_30_032: [ If dns_resolver_is_create_complete has returned true and the lookup process has succeeded, dns_resolver_get_ipv4 shall return the discovered IPv4 address. ]*/
                        dns->ip_v4 = EXTRACT_IPV4(ptr);
                        dns->is_failed = false;
                        break;
#ifdef IPV6_ENABLED
                    case AF_INET6:
                        memcpy(dns->ip_v6, EXTRACT_IPV6(ptr), 16);
                        dns->is_failed = false;
                        break;     
#endif // IPV6_ENABLED
                    }
                }
                /* Codes_SRS_dns_resolver_30_033: [ If dns_resolver_is_create_complete has returned true and the lookup process has failed, dns_resolver_get_ipv4 shall return 0. ]*/
#ifdef IPV6_ENABLED
                uint8_t zero[16] = { 0 }; // IPv6 address of all zeroes
                dns->is_failed = (dns->ip_v4 == 0) && (memcmp(dns->ip_v6, zero, 16) == 0);
#else
                dns->is_failed = (dns->ip_v4 == 0);
#endif // IPV6_ENABLED
            }
            else
            {
                /* Codes_SRS_dns_resolver_30_033: [ If dns_resolver_is_create_complete has returned true and the lookup process has failed, dns_resolver_get_ipv4 shall return 0. ]*/
                LogInfo("Failed DNS lookup for %s: %d", dns->hostname, getAddrResult);
                dns->is_failed = true;
            }

            /* Codes_SRS_dns_resolver_30_021: [ dns_resolver_is_create_complete shall perform the asynchronous work of DNS lookup and log any errors. ]*/
            // Only make one attempt at lookup for this
            // synchronous implementation
            dns->is_complete = true;

            // This synchronous implementation is incapable of being incomplete, so SRS_dns_resolver_30_023 does not ever happen
            /* Codes_SRS_dns_resolver_30_023: [ If the DNS lookup process is not yet complete, dns_resolver_is_create_complete shall return false. ]*/
            /* Codes_SRS_dns_resolver_30_022: [ If the DNS lookup process has completed, dns_resolver_is_create_complete shall return true. ]*/
            result = true;
        }
    }

    return result;
}